

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

string * __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,unsigned_int,(glm::qualifier)0>>::
summaryString_abi_cxx11_
          (string *__return_storage_ptr__,
          ManagedBuffer<glm::vec<3,unsigned_int,(glm::qualifier)0>> *this)

{
  CanonicalDataSource CVar1;
  size_t __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  std::operator+(&local_30,"[",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 8));
  std::operator+(&local_50,&local_30,"]");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  CVar1 = ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::currentCanonicalDataSource
                    ((ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *)this);
  if (CVar1 < (RenderBuffer|NeedsCompute)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  __val = ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::size
                    ((ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *)this);
  std::__cxx11::to_string(&local_30,__val);
  std::operator+(&local_50," size: ",&local_30);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (*(uint *)(this + 0x90) < 4) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ManagedBuffer<T>::summaryString() {

  std::string str = "";

  str += "[" + name + "]";
  str += "   status: ";
  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    str += "HostData";
    break;
  case CanonicalDataSource::NeedsCompute:
    str += "NeedsCompute";
    break;
  case CanonicalDataSource::RenderBuffer:
    str += "Renderbuffer";
    break;
  };
  str += " size: " + std::to_string(size());
  str += " device type: ";
  switch (deviceBufferType) {
  case DeviceBufferType::Attribute:
    str += "Attribute";
    break;
  case DeviceBufferType::Texture1d:
    str += "Texture1d";
    break;
  case DeviceBufferType::Texture2d:
    str += "Texture2d";
    break;
  case DeviceBufferType::Texture3d:
    str += "Texture3d";
    break;
  }

  return str;
}